

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AtomNameVisitor.cpp
# Opt level: O0

string * __thiscall OpenMD::AtomNameVisitor::toString_abi_cxx11_(AtomNameVisitor *this)

{
  undefined8 uVar1;
  string *in_RDI;
  char buffer [65535];
  string *result;
  char acStack_10018 [65560];
  
  std::__cxx11::string::string((string *)in_RDI);
  snprintf(acStack_10018,0xffff,
           "------------------------------------------------------------------\n");
  std::__cxx11::string::operator+=((string *)in_RDI,acStack_10018);
  uVar1 = std::__cxx11::string::c_str();
  snprintf(acStack_10018,0xffff,"Visitor name: %s\n",uVar1);
  std::__cxx11::string::operator+=((string *)in_RDI,acStack_10018);
  snprintf(acStack_10018,0xffff,"Visitor Description: print base atom types\n");
  std::__cxx11::string::operator+=((string *)in_RDI,acStack_10018);
  snprintf(acStack_10018,0xffff,
           "------------------------------------------------------------------\n");
  std::__cxx11::string::operator+=((string *)in_RDI,acStack_10018);
  return in_RDI;
}

Assistant:

const std::string AtomNameVisitor::toString() {
    char buffer[65535];
    std::string result;

    snprintf(
        buffer, 65535,
        "------------------------------------------------------------------\n");
    result += buffer;

    snprintf(buffer, 65535, "Visitor name: %s\n", visitorName.c_str());
    result += buffer;

    snprintf(buffer, 65535, "Visitor Description: print base atom types\n");
    result += buffer;

    snprintf(
        buffer, 65535,
        "------------------------------------------------------------------\n");
    result += buffer;

    return result;
  }